

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O0

void __thiscall
rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
::rmq(rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
      *this,__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            begin,
     __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
     end,unsigned_long superblock_size,unsigned_long block_size)

{
  allocator<unsigned_short> *this_00;
  value_type vVar1;
  bool bVar2;
  unsigned_short uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  value_type vVar6;
  unsigned_long *puVar7;
  reference pvVar8;
  reference pvVar9;
  reference puVar10;
  size_type sVar11;
  reference pvVar12;
  reference pvVar13;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_258;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_250;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_248;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_240;
  unsigned_long local_238;
  unsigned_long local_230;
  unsigned_long local_228;
  unsigned_long right_idx_1;
  unsigned_long i_1;
  ulong local_210;
  unsigned_long blocks_in_sb;
  unsigned_long sb_offset;
  unsigned_long pre_sb_offset;
  unsigned_long sb;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_1e8;
  long local_1d0;
  unsigned_long last_sb_cur_nblocks;
  unsigned_long dist_1;
  unsigned_long last_sb_nblocks;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b0;
  unsigned_long local_1a8;
  unsigned_long local_1a0;
  unsigned_long local_198;
  unsigned_long right_idx;
  unsigned_long i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_180;
  ulong local_168;
  unsigned_long dist;
  unsigned_long level;
  unsigned_long *local_150;
  unsigned_long *local_148;
  unsigned_long *local_140;
  unsigned_long *local_138;
  unsigned_long *local_130;
  unsigned_long *local_128;
  unsigned_long *local_120;
  ulong local_118;
  unsigned_long block_min_idx;
  unsigned_long *local_108;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_100;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  block_min_pos;
  unsigned_long local_e8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  block_end_it;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  block_it;
  unsigned_long local_c0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  sb_end_it;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  min_pos;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_98;
  allocator<unsigned_long> local_79;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *local_60;
  unsigned_long *local_58;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *local_40;
  unsigned_long *local_38;
  unsigned_long local_30;
  unsigned_long block_size_local;
  unsigned_long superblock_size_local;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *this_local;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  (this->_begin)._M_current = begin._M_current;
  (this->_end)._M_current = end._M_current;
  this->superblock_size = superblock_size;
  this->block_size = block_size;
  local_30 = block_size;
  block_size_local = superblock_size;
  superblock_size_local = (unsigned_long)this;
  this_local = (rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                *)end._M_current;
  end_local = begin;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->superblock_mins);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&this->block_mins);
  local_38 = end_local._M_current;
  local_40 = this_local;
  uVar4 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (end_local,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )this_local);
  uVar5 = std::numeric_limits<unsigned_long>::max();
  if (uVar5 <= uVar4) {
    __assert_fail("(index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x50,
                  "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  local_58 = end_local._M_current;
  local_60 = this_local;
  uVar5 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (end_local,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )this_local);
  this->n = uVar5;
  if (block_size_local % local_30 != 0) {
    __assert_fail("superblock_size % block_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x55,
                  "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  this->n_superblocks = (this->n - 1) / block_size_local + 1;
  this->n_blocks = (this->n - 1) / local_30 + 1;
  this->n_blocks_per_superblock = block_size_local / local_30;
  uVar4 = block_size_local - 1;
  uVar3 = std::numeric_limits<unsigned_short>::max();
  if (uVar3 < uVar4) {
    __assert_fail("superblock_size-1 <= std::numeric_limits<uint16_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x5c,
                  "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  sVar11 = this->n_superblocks;
  std::allocator<unsigned_long>::allocator(&local_79);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,sVar11,&local_79);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::push_back(&this->superblock_mins,&local_78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_78);
  std::allocator<unsigned_long>::~allocator(&local_79);
  sVar11 = this->n_blocks;
  this_00 = (allocator<unsigned_short> *)((long)&it._M_current + 7);
  std::allocator<unsigned_short>::allocator(this_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_98,sVar11,this_00);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::push_back(&this->block_mins,&local_98);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_98);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)((long)&it._M_current + 7));
  min_pos = end_local;
  while (bVar2 = __gnu_cxx::operator!=
                           (&min_pos,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)&this_local), bVar2) {
    sb_end_it = min_pos;
    local_b8._M_current = min_pos._M_current;
    local_c0 = std::
               distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (min_pos,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   )this_local);
    puVar7 = std::min<unsigned_long>(&local_c0,&block_size_local);
    std::
    advance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
              (&local_b8,*puVar7);
    block_end_it = min_pos;
    while (bVar2 = __gnu_cxx::operator!=(&block_end_it,&local_b8), bVar2) {
      local_e0._M_current = block_end_it._M_current;
      block_min_pos._M_current = &this_local->n;
      local_e8 = std::
                 distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                           (block_end_it,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )this_local);
      puVar7 = std::min<unsigned_long>(&local_e8,&local_30);
      std::
      advance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                (&local_e0,*puVar7);
      local_108 = block_end_it._M_current;
      block_min_idx = (unsigned_long)local_e0._M_current;
      local_100 = std::
                  min_element<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (block_end_it,local_e0);
      puVar10 = __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_100);
      uVar4 = *puVar10;
      puVar10 = __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&sb_end_it);
      if (uVar4 < *puVar10) {
        sb_end_it._M_current = local_100._M_current;
      }
      local_120 = min_pos._M_current;
      local_128 = local_100._M_current;
      local_118 = std::
                  distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            (min_pos,local_100);
      if (block_size_local <= local_118) {
        __assert_fail("block_min_idx < superblock_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0x73,
                      "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                     );
      }
      vVar1 = (value_type)local_118;
      pvVar12 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&this->block_mins,0);
      local_130 = end_local._M_current;
      local_138 = block_end_it._M_current;
      uVar4 = std::
              distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        (end_local,block_end_it);
      pvVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (pvVar12,uVar4 / local_30);
      *pvVar13 = vVar1;
      block_end_it._M_current = local_e0._M_current;
    }
    local_140 = end_local._M_current;
    local_148 = sb_end_it._M_current;
    vVar6 = std::
            distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (end_local,sb_end_it);
    pvVar8 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->superblock_mins,0);
    local_150 = end_local._M_current;
    level = (unsigned_long)min_pos._M_current;
    uVar4 = std::
            distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      (end_local,min_pos);
    pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (pvVar8,uVar4 / block_size_local);
    *pvVar9 = vVar6;
    min_pos._M_current = local_b8._M_current;
  }
  dist = 1;
  local_168 = 2;
  do {
    if (this->n_superblocks <= local_168 >> 1) {
      dist = 1;
      dist_1 = this->n_blocks - (this->n_superblocks - 1) * this->n_blocks_per_superblock;
      last_sb_cur_nblocks = 2;
      while ((uVar4 = last_sb_cur_nblocks >> 1,
             puVar7 = std::min<unsigned_long>(&this->n_blocks,&this->n_blocks_per_superblock),
             uVar4 < *puVar7 && (this->n_blocks != this->n_superblocks * last_sb_cur_nblocks >> 1)))
      {
        local_1d0 = 0;
        if (last_sb_cur_nblocks >> 1 < dist_1) {
          local_1d0 = dist_1 - (last_sb_cur_nblocks >> 1);
        }
        sVar11 = (this->n_superblocks - 1) *
                 (this->n_blocks_per_superblock - (last_sb_cur_nblocks >> 1)) + local_1d0;
        std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)((long)&sb + 7));
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&local_1e8,sVar11,(allocator<unsigned_short> *)((long)&sb + 7));
        std::
        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ::push_back(&this->block_mins,&local_1e8);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_1e8);
        std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)((long)&sb + 7));
        for (pre_sb_offset = 0; pre_sb_offset < this->n_superblocks;
            pre_sb_offset = pre_sb_offset + 1) {
          sb_offset = pre_sb_offset * (this->n_blocks_per_superblock - (last_sb_cur_nblocks >> 2));
          blocks_in_sb = pre_sb_offset *
                         (this->n_blocks_per_superblock - (last_sb_cur_nblocks >> 1));
          i_1 = this->n_blocks - pre_sb_offset * this->n_blocks_per_superblock;
          puVar7 = std::min<unsigned_long>(&i_1,&this->n_blocks_per_superblock);
          local_210 = *puVar7;
          for (right_idx_1 = 0; right_idx_1 + (last_sb_cur_nblocks >> 1) < local_210;
              right_idx_1 = right_idx_1 + 1) {
            local_230 = right_idx_1 + (last_sb_cur_nblocks >> 1);
            local_238 = (local_210 - (last_sb_cur_nblocks >> 2)) - 1;
            puVar7 = std::min<unsigned_long>(&local_230,&local_238);
            local_228 = *puVar7;
            pvVar12 = std::
                      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      ::operator[](&this->block_mins,dist - 1);
            pvVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                (pvVar12,right_idx_1 + sb_offset);
            local_248 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator+(&end_local,(ulong)*pvVar13);
            local_240 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator+(&local_248,pre_sb_offset * block_size_local);
            puVar10 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&local_240);
            uVar4 = *puVar10;
            pvVar12 = std::
                      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      ::operator[](&this->block_mins,dist - 1);
            pvVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                (pvVar12,local_228 + sb_offset);
            local_258 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator+(&end_local,(ulong)*pvVar13);
            local_250 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator+(&local_258,pre_sb_offset * block_size_local);
            puVar10 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&local_250);
            if (uVar4 < *puVar10) {
              pvVar12 = std::
                        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ::operator[](&this->block_mins,dist - 1);
              pvVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                  (pvVar12,right_idx_1 + sb_offset);
              vVar1 = *pvVar13;
              pvVar12 = std::
                        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ::back(&this->block_mins);
              pvVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                  (pvVar12,right_idx_1 + blocks_in_sb);
              *pvVar13 = vVar1;
            }
            else {
              pvVar12 = std::
                        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ::operator[](&this->block_mins,dist - 1);
              pvVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                  (pvVar12,local_228 + sb_offset);
              vVar1 = *pvVar13;
              pvVar12 = std::
                        vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ::back(&this->block_mins);
              pvVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                  (pvVar12,right_idx_1 + blocks_in_sb);
              *pvVar13 = vVar1;
            }
          }
        }
        dist = dist + 1;
        last_sb_cur_nblocks = last_sb_cur_nblocks << 1;
      }
      return;
    }
    uVar5 = this->n_superblocks;
    uVar4 = local_168 >> 1;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_180,uVar5 - uVar4,(allocator<unsigned_long> *)((long)&i + 7));
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back(&this->superblock_mins,&local_180);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_180);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
    for (right_idx = 0; right_idx + (local_168 >> 1) < this->n_superblocks;
        right_idx = right_idx + 1) {
      local_1a0 = right_idx + (local_168 >> 1);
      local_1a8 = (this->n_superblocks - (local_168 >> 2)) - 1;
      puVar7 = std::min<unsigned_long>(&local_1a0,&local_1a8);
      local_198 = *puVar7;
      pvVar8 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->superblock_mins,dist - 1);
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar8,right_idx);
      local_1b0 = __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+(&end_local,*pvVar9);
      puVar10 = __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_1b0);
      uVar4 = *puVar10;
      pvVar8 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->superblock_mins,dist - 1);
      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar8,local_198);
      last_sb_nblocks =
           (unsigned_long)
           __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator+(&end_local,*pvVar9);
      puVar10 = __gnu_cxx::
                __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&last_sb_nblocks);
      uVar5 = right_idx;
      if (uVar4 < *puVar10) {
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::back(&this->superblock_mins);
        sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
        if (sVar11 <= uVar5) {
          __assert_fail("i < superblock_mins.back().size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x82,
                        "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                       );
        }
        sVar11 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::size(&this->superblock_mins);
        if (sVar11 != dist + 1) {
          __assert_fail("superblock_mins.size() == level+1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x83,
                        "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                       );
        }
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&this->superblock_mins,dist - 1);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,right_idx);
        vVar6 = *pvVar9;
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::back(&this->superblock_mins);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,right_idx);
        *pvVar9 = vVar6;
      }
      else {
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::back(&this->superblock_mins);
        sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
        if (sVar11 <= uVar5) {
          __assert_fail("i < superblock_mins.back().size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x86,
                        "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                       );
        }
        sVar11 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::size(&this->superblock_mins);
        if (sVar11 != dist + 1) {
          __assert_fail("superblock_mins.size() == level+1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x87,
                        "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                       );
        }
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&this->superblock_mins,dist - 1);
        sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
        if (sVar11 <= local_198) {
          __assert_fail("superblock_mins[level-1].size() > right_idx",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x88,
                        "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                       );
        }
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&this->superblock_mins,dist - 1);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,local_198);
        vVar6 = *pvVar9;
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::back(&this->superblock_mins);
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar8,right_idx);
        *pvVar9 = vVar6;
      }
    }
    dist = dist + 1;
    local_168 = local_168 << 1;
  } while( true );
}

Assistant:

rmq(Iterator begin, Iterator end,
        index_t superblock_size = DEFAULT_SUPERBLOCK_SIZE,
        index_t block_size = DEFAULT_BLOCK_SIZE)
        : _begin(begin), _end(end), superblock_size(superblock_size), block_size(block_size)
    {
        // get size
        assert((index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max());
        n = std::distance(begin, end);


        // superblock size should be divisable by block size
        assert(superblock_size % block_size == 0);

        // get number of blocks
        n_superblocks = (n-1) / superblock_size + 1;
        n_blocks = (n-1) / block_size + 1;
        n_blocks_per_superblock = superblock_size / block_size;

        assert(superblock_size-1 <= std::numeric_limits<uint16_t>::max());


        // start by finding index of mins per block
        // for each superblock
        superblock_mins.push_back(std::vector<index_t>(n_superblocks));
        block_mins.push_back(std::vector<uint16_t>(n_blocks));
        Iterator it = begin;
        while (it != end) {
            // find index of minimum block in superblock
            Iterator min_pos = it;
            Iterator sb_end_it = it;
            std::advance(sb_end_it, std::min<std::size_t>(std::distance(it, end), superblock_size));
            for (Iterator block_it = it; block_it != sb_end_it; ) {
                Iterator block_end_it = block_it;
                std::advance(block_end_it, std::min<std::size_t>(std::distance(block_it, end), block_size));
                Iterator block_min_pos = std::min_element(block_it, block_end_it);
                // save minimum for superblock min
                if (*block_min_pos < *min_pos) {
                    min_pos = block_min_pos;
                }
                // save minimum for block min, relative to superblock start
                index_t block_min_idx = static_cast<index_t>(std::distance(it, block_min_pos));
                assert(block_min_idx < superblock_size);
                block_mins[0][std::distance(begin, block_it) / block_size] = static_cast<uint16_t>(block_min_idx);
                block_it = block_end_it;
            }
            superblock_mins[0][std::distance(begin, it) / superblock_size] = static_cast<index_t>(std::distance(begin, min_pos));
            it = sb_end_it;
        }

        // fill superblock lookup with dynamic programming
        index_t level = 1;
        for (index_t dist = 2; dist/2 < n_superblocks; dist <<= 1) {
            superblock_mins.push_back(std::vector<index_t>(n_superblocks - dist/2));
            for (index_t i = 0; i+dist/2 < n_superblocks; ++i) {
                index_t right_idx = std::min(i+dist/2, n_superblocks-dist/4-1);
                if (*(begin + superblock_mins[level-1][i]) < *(begin + superblock_mins[level-1][right_idx])) {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    superblock_mins.back()[i] = superblock_mins[level-1][i];
                } else {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    assert(superblock_mins[level-1].size() > right_idx);
                    superblock_mins.back()[i] = superblock_mins[level-1][right_idx];
                }
            }
            level++;
        }

        // now the same thing for blocks (but index relative to their
        // superblock)
        level = 1;
        index_t last_sb_nblocks = n_blocks - (n_superblocks-1)*n_blocks_per_superblock;
        for (index_t dist = 2; dist/2 < std::min(n_blocks,n_blocks_per_superblock); dist <<= 1) {
            if (n_blocks - n_superblocks*dist/2 == 0)
                break;
            index_t last_sb_cur_nblocks = 0;
            if (last_sb_nblocks > dist/2)
                last_sb_cur_nblocks = last_sb_nblocks - dist/2;
            block_mins.push_back(std::vector<uint16_t>((n_superblocks-1)*(n_blocks_per_superblock - dist/2) + last_sb_cur_nblocks));
            for (index_t sb = 0; sb < n_superblocks; ++sb) {
                index_t pre_sb_offset = sb*(n_blocks_per_superblock - dist/4);
                index_t sb_offset = sb*(n_blocks_per_superblock - dist/2);
                index_t blocks_in_sb = std::min(n_blocks - sb*n_blocks_per_superblock, n_blocks_per_superblock);
                for (index_t i = 0; i+dist/2 < blocks_in_sb; ++i) {
                    // TODO: right_idx might become negative for last superblock??
                    index_t right_idx = std::min(i + dist/2, blocks_in_sb-dist/4-1);
                    if (*(begin + block_mins[level-1][i        +pre_sb_offset] + sb*superblock_size)
                      < *(begin + block_mins[level-1][right_idx+pre_sb_offset] + sb*superblock_size))
                    {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][i+pre_sb_offset];
                    } else {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][right_idx+pre_sb_offset];
                    }
                }
            }
            level++;
        }

        //assert(check_superblock_correctness());
        //assert(check_block_correctness());
    }